

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<unsigned_char>,InputStream>
               (string_view full_tag,string_view tag,StoreT<unsigned_char> *visitor,
               InputStream *istream,int max_recursion)

{
  char cVar1;
  string_view tag_00;
  string_view full_tag_00;
  string_view tag_01;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  bool bVar2;
  runtime_error *this;
  const_reference pcVar3;
  char *in_RCX;
  StoreT<unsigned_char> *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  size_t in_R9;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  StoreT<unsigned_char> *in_stack_00000010;
  string_view in_stack_00000018;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  string_view *in_stack_ffffffffffffff18;
  InputStream *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff70;
  InputStream *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  InputStream *in_stack_ffffffffffffff90;
  StoreT<unsigned_char> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  InputStream *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  string_view in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  
  if (in_stack_00000008 != 0) {
    bVar2 = string_view::empty((string_view *)&stack0xffffffffffffffe0);
    if (!bVar2) {
      pcVar3 = string_view::front((string_view *)&stack0xffffffffffffffe0);
      cVar1 = *pcVar3;
      if (cVar1 == '(') {
        full_tag_00._len = in_stack_ffffffffffffff60;
        full_tag_00._ptr = in_RSI;
        tag_00._len = in_RDI;
        tag_00._ptr = in_RCX;
        visit_tuple<(anonymous_namespace)::StoreT<unsigned_char>,InputStream>
                  (full_tag_00,tag_00,in_RDX,in_stack_ffffffffffffff38,in_stack_ffffffffffffff70);
      }
      else if (cVar1 == '/') {
        visit_enum<(anonymous_namespace)::StoreT<unsigned_char>,InputStream>
                  (in_stack_00000018,in_stack_00000010,
                   (InputStream *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      }
      else if (cVar1 == '<') {
        full_tag_01._len._0_7_ = in_stack_ffffffffffffffa0;
        full_tag_01._ptr = (char *)in_stack_ffffffffffffff98;
        full_tag_01._len._7_1_ = in_stack_ffffffffffffffa7;
        tag_01._len = (size_t)in_stack_ffffffffffffff90;
        tag_01._ptr = in_stack_ffffffffffffff88;
        visit_variant<(anonymous_namespace)::StoreT<unsigned_char>,InputStream>
                  (full_tag_01,tag_01,
                   (StoreT<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0);
      }
      else if (cVar1 == '[') {
        full_tag_02._len = in_R9;
        full_tag_02._ptr = in_stack_ffffffffffffffc8;
        visit_sequence<(anonymous_namespace)::StoreT<unsigned_char>,InputStream>
                  (full_tag_02,in_stack_ffffffffffffffb8,
                   (StoreT<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,(int)in_RDX);
      }
      else if (cVar1 == '{') {
        full_tag_03._len = in_R9;
        full_tag_03._ptr = in_stack_ffffffffffffffc8;
        visit_struct<(anonymous_namespace)::StoreT<unsigned_char>,InputStream>
                  (full_tag_03,in_stack_ffffffffffffffb8,
                   (StoreT<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,(int)in_RDX);
      }
      else {
        string_view::front((string_view *)&stack0xffffffffffffffe0);
        visit_arithmetic<(anonymous_namespace)::StoreT<unsigned_char>,InputStream>
                  (in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  string_view::to_string_abi_cxx11_(in_stack_ffffffffffffff18);
  std::operator+((char *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffffb0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}